

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O2

void __thiscall
TPZEulerAnalysis::TPZEulerAnalysis(TPZEulerAnalysis *this,TPZFlowCompMesh *mesh,ostream *out)

{
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_017a0fc8,&mesh->super_TPZCompMesh,true,out);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEulerAnalysis_017a0ea8;
  this->fFlowCompMesh = mesh;
  TPZFMatrix<double>::TPZFMatrix(&this->fRhsLast);
  this->fNewtonEps = 1e-09;
  this->fNewtonMaxIter = 10;
  this->fTimeIntEps = 1e-08;
  this->fTimeIntMaxIter = 100;
  this->fEvolCFL = 0;
  this->fpBlockDiag = (TPZBlockDiagonal<double> *)0x0;
  this->fHasFrontalPreconditioner = 0;
  return;
}

Assistant:

TPZEulerAnalysis::TPZEulerAnalysis(TPZFlowCompMesh *mesh, std::ostream &out):
TPZLinearAnalysis(mesh, true, out), fFlowCompMesh(mesh),
fRhsLast(),
fNewtonEps(1e-9),  fNewtonMaxIter(10),
fTimeIntEps(1e-8), fTimeIntMaxIter(100),
fEvolCFL(0), fpBlockDiag(NULL),fHasFrontalPreconditioner(0)
{
	
}